

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gls::TextureStateQueryTests::anon_unknown_1::TextureSRGBDecodeCase::test
          (TextureSRGBDecodeCase *this,CallLogWrapper *gl,ResultCollector *result)

{
  TestLog *pTVar1;
  bool bVar2;
  bool bVar3;
  GLenum GVar4;
  TesterType TVar5;
  GLfloat decodeFloat;
  GLint decodeInt;
  ScopedLogSection section;
  ScopedLogSection section_1;
  Texture texture;
  allocator<char> local_101;
  GLfloat local_100;
  GLuint local_fc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  ScopedLogSection local_58;
  code *local_50;
  GLenum local_48;
  ObjectWrapper local_40;
  
  TVar5 = (this->super_TextureTest).m_tester;
  bVar2 = isPureIntTester(TVar5);
  bVar3 = true;
  if (!bVar2) {
    bVar3 = isPureUintTester(TVar5);
  }
  glu::TypedObjectWrapper<(glu::ObjectType)0>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)0> *)&local_40,
             (this->super_TextureTest).m_renderCtx);
  glu::CallLogWrapper::glBindTexture(gl,(this->super_TextureTest).m_target,local_40.m_object);
  GVar4 = glu::CallLogWrapper::glGetError(gl);
  if (GVar4 != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"Got Error ",(allocator<char> *)&local_58);
    local_50 = glu::getErrorName;
    local_48 = GVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_78,&local_50);
    std::operator+(&local_b8,&local_98,&local_78);
    std::operator+(&local_f8,&local_b8,": ");
    std::operator+(&local_d8,&local_f8,"bind");
    tcu::ResultCollector::fail(result,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
  }
  if (bVar3 == false) {
    pTVar1 = ((this->super_TextureTest).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"Initial",(allocator<char> *)&local_98);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,"Initial",(allocator<char> *)&local_78);
    tcu::ScopedLogSection::ScopedLogSection
              ((ScopedLogSection *)&local_b8,pTVar1,&local_d8,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_d8);
    StateQueryUtil::verifyStateTextureParamInteger
              (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,0x8a49
               ,(this->super_TextureTest).m_type);
    tcu::ScopedLogSection::~ScopedLogSection((ScopedLogSection *)&local_b8);
    pTVar1 = ((this->super_TextureTest).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"Toggle",(allocator<char> *)&local_b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,"Toggle",(allocator<char> *)&local_98);
    tcu::ScopedLogSection::ScopedLogSection(&local_58,pTVar1,&local_d8,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_d8);
    local_fc = 0x8a49;
    local_100 = 35401.0;
    glu::CallLogWrapper::glTexParameteri
              (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,0x8a4a);
    GVar4 = glu::CallLogWrapper::glGetError(gl);
    if (GVar4 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"Got Error ",&local_101);
      local_50 = glu::getErrorName;
      local_48 = GVar4;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_78,&local_50);
      std::operator+(&local_b8,&local_98,&local_78);
      std::operator+(&local_f8,&local_b8,": ");
      std::operator+(&local_d8,&local_f8,"set state");
      tcu::ResultCollector::fail(result,&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_98);
    }
    StateQueryUtil::verifyStateTextureParamInteger
              (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,0x8a4a
               ,(this->super_TextureTest).m_type);
    glu::CallLogWrapper::glTexParameteriv
              (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
               (GLint *)&local_fc);
    GVar4 = glu::CallLogWrapper::glGetError(gl);
    if (GVar4 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"Got Error ",&local_101);
      local_50 = glu::getErrorName;
      local_48 = GVar4;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_78,&local_50);
      std::operator+(&local_b8,&local_98,&local_78);
      std::operator+(&local_f8,&local_b8,": ");
      std::operator+(&local_d8,&local_f8,"set state");
      tcu::ResultCollector::fail(result,&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_98);
    }
    StateQueryUtil::verifyStateTextureParamInteger
              (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,0x8a49
               ,(this->super_TextureTest).m_type);
    glu::CallLogWrapper::glTexParameterf
              (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,35402.0);
    GVar4 = glu::CallLogWrapper::glGetError(gl);
    if (GVar4 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"Got Error ",&local_101);
      local_50 = glu::getErrorName;
      local_48 = GVar4;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_78,&local_50);
      std::operator+(&local_b8,&local_98,&local_78);
      std::operator+(&local_f8,&local_b8,": ");
      std::operator+(&local_d8,&local_f8,"set state");
      tcu::ResultCollector::fail(result,&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_98);
    }
    StateQueryUtil::verifyStateTextureParamInteger
              (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,0x8a4a
               ,(this->super_TextureTest).m_type);
    glu::CallLogWrapper::glTexParameterfv
              (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,&local_100);
    GVar4 = glu::CallLogWrapper::glGetError(gl);
    if (GVar4 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"Got Error ",&local_101);
      local_50 = glu::getErrorName;
      local_48 = GVar4;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_78,&local_50);
      std::operator+(&local_b8,&local_98,&local_78);
      std::operator+(&local_f8,&local_b8,": ");
      std::operator+(&local_d8,&local_f8,"set state");
      tcu::ResultCollector::fail(result,&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_98);
    }
    StateQueryUtil::verifyStateTextureParamInteger
              (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,0x8a49
               ,(this->super_TextureTest).m_type);
    tcu::ScopedLogSection::~ScopedLogSection(&local_58);
  }
  TVar5 = (this->super_TextureTest).m_tester;
  bVar2 = isPureIntTester(TVar5);
  if (bVar2) {
    local_58.m_log._0_4_ = 0x8a4a;
    local_fc = 0x8a49;
    glu::CallLogWrapper::glTexParameterIiv
              (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
               (GLint *)&local_58);
    GVar4 = glu::CallLogWrapper::glGetError(gl);
    if (GVar4 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"Got Error ",(allocator<char> *)&local_100);
      local_50 = glu::getErrorName;
      local_48 = GVar4;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_78,&local_50);
      std::operator+(&local_b8,&local_98,&local_78);
      std::operator+(&local_f8,&local_b8,": ");
      std::operator+(&local_d8,&local_f8,"glTexParameterIiv");
      tcu::ResultCollector::fail(result,&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_98);
    }
    StateQueryUtil::verifyStateTextureParamInteger
              (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,0x8a4a
               ,(this->super_TextureTest).m_type);
    glu::CallLogWrapper::glTexParameterIiv
              (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
               (GLint *)&local_fc);
    GVar4 = glu::CallLogWrapper::glGetError(gl);
    if (GVar4 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"Got Error ",(allocator<char> *)&local_100);
      local_50 = glu::getErrorName;
      local_48 = GVar4;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_78,&local_50);
      std::operator+(&local_b8,&local_98,&local_78);
      std::operator+(&local_f8,&local_b8,": ");
      std::operator+(&local_d8,&local_f8,"glTexParameterIiv");
      tcu::ResultCollector::fail(result,&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_98);
    }
    StateQueryUtil::verifyStateTextureParamInteger
              (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,0x8a49
               ,(this->super_TextureTest).m_type);
    TVar5 = (this->super_TextureTest).m_tester;
  }
  bVar2 = isPureUintTester(TVar5);
  if (bVar2) {
    local_58.m_log._0_4_ = 0x8a4a;
    local_fc = 0x8a49;
    glu::CallLogWrapper::glTexParameterIuiv
              (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
               (GLuint *)&local_58);
    GVar4 = glu::CallLogWrapper::glGetError(gl);
    if (GVar4 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"Got Error ",(allocator<char> *)&local_100);
      local_50 = glu::getErrorName;
      local_48 = GVar4;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_78,&local_50);
      std::operator+(&local_b8,&local_98,&local_78);
      std::operator+(&local_f8,&local_b8,": ");
      std::operator+(&local_d8,&local_f8,"glTexParameterIuiv");
      tcu::ResultCollector::fail(result,&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_98);
    }
    StateQueryUtil::verifyStateTextureParamInteger
              (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,0x8a4a
               ,(this->super_TextureTest).m_type);
    glu::CallLogWrapper::glTexParameterIuiv
              (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,&local_fc);
    GVar4 = glu::CallLogWrapper::glGetError(gl);
    if (GVar4 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"Got Error ",(allocator<char> *)&local_100);
      local_50 = glu::getErrorName;
      local_48 = GVar4;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_78,&local_50);
      std::operator+(&local_b8,&local_98,&local_78);
      std::operator+(&local_f8,&local_b8,": ");
      std::operator+(&local_d8,&local_f8,"glTexParameterIuiv");
      tcu::ResultCollector::fail(result,&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_98);
    }
    StateQueryUtil::verifyStateTextureParamInteger
              (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,0x8a49
               ,(this->super_TextureTest).m_type);
  }
  glu::ObjectWrapper::~ObjectWrapper(&local_40);
  return;
}

Assistant:

void TextureSRGBDecodeCase::test (glu::CallLogWrapper& gl, tcu::ResultCollector& result) const
{
	const bool		isPureCase	= isPureIntTester(m_tester) || isPureUintTester(m_tester);
	glu::Texture	texture		(m_renderCtx);

	gl.glBindTexture(m_target, *texture);
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "bind");

	if (!isPureCase)
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Initial", "Initial");
		verifyStateTextureParamInteger(result, gl, m_target, m_pname, GL_DECODE_EXT, m_type);
	}

	if (!isPureCase)
	{
		const tcu::ScopedLogSection	section			(m_testCtx.getLog(), "Toggle", "Toggle");
		const glw::GLint			decodeInt		= GL_DECODE_EXT;
		const glw::GLfloat			decodeFloat		= (glw::GLfloat)GL_DECODE_EXT;

		gl.glTexParameteri(m_target, m_pname, GL_SKIP_DECODE_EXT);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "set state");
		verifyStateTextureParamInteger(result, gl, m_target, m_pname, GL_SKIP_DECODE_EXT, m_type);

		gl.glTexParameteriv(m_target, m_pname, &decodeInt);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "set state");
		verifyStateTextureParamInteger(result, gl, m_target, m_pname, GL_DECODE_EXT, m_type);

		gl.glTexParameterf(m_target, m_pname, GL_SKIP_DECODE_EXT);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "set state");
		verifyStateTextureParamInteger(result, gl, m_target, m_pname, GL_SKIP_DECODE_EXT, m_type);

		gl.glTexParameterfv(m_target, m_pname, &decodeFloat);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "set state");
		verifyStateTextureParamInteger(result, gl, m_target, m_pname, GL_DECODE_EXT, m_type);
	}

	if (isPureIntTester(m_tester))
	{
		const glw::GLint skipDecode	= GL_SKIP_DECODE_EXT;
		const glw::GLint decode		= GL_DECODE_EXT;

		gl.glTexParameterIiv(m_target, m_pname, &skipDecode);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameterIiv");
		verifyStateTextureParamInteger(result, gl, m_target, m_pname, GL_SKIP_DECODE_EXT, m_type);

		gl.glTexParameterIiv(m_target, m_pname, &decode);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameterIiv");
		verifyStateTextureParamInteger(result, gl, m_target, m_pname, GL_DECODE_EXT, m_type);
	}

	if (isPureUintTester(m_tester))
	{
		const glw::GLuint skipDecode	= GL_SKIP_DECODE_EXT;
		const glw::GLuint decode		= GL_DECODE_EXT;

		gl.glTexParameterIuiv(m_target, m_pname, &skipDecode);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameterIuiv");
		verifyStateTextureParamInteger(result, gl, m_target, m_pname, GL_SKIP_DECODE_EXT, m_type);

		gl.glTexParameterIuiv(m_target, m_pname, &decode);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameterIuiv");
		verifyStateTextureParamInteger(result, gl, m_target, m_pname, GL_DECODE_EXT, m_type);
	}
}